

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calculator_target.hpp
# Opt level: O3

Result __thiscall
ruckig::TargetCalculator<1UL,_ruckig::StandardVector>::calculate<true>
          (TargetCalculator<1UL,_ruckig::StandardVector> *this,
          InputParameter<1UL,_ruckig::StandardVector> *inp,
          Trajectory<1UL,_ruckig::StandardVector> *traj,double delta_time,bool *was_interrupted)

{
  double *t_sync;
  size_t *psVar1;
  StandardVector<Synchronization,_1UL> *pSVar2;
  Block *pBVar3;
  Profile *this_00;
  undefined8 *puVar4;
  double *pdVar5;
  double dVar6;
  ControlInterface CVar7;
  Synchronization SVar8;
  ControlSigns CVar9;
  size_t sVar10;
  pointer paVar11;
  undefined8 uVar12;
  char cVar13;
  bool bVar14;
  long lVar15;
  Synchronization *pSVar16;
  RuckigError *pRVar17;
  long *plVar18;
  size_t sVar19;
  ControlInterface *pCVar20;
  long lVar21;
  size_type *psVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  ulong uVar26;
  byte bVar27;
  long lVar28;
  long lVar29;
  StandardVector<Block,_1UL> *pSVar30;
  long lVar31;
  unsigned_long uVar32;
  long lVar33;
  _Storage<unsigned_long,_true> _Var34;
  ulong uVar35;
  pointer paVar36;
  bool *pbVar37;
  bool bVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  optional<double> t_min;
  PositionFirstOrderStep1 step1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f60;
  Block *local_f40;
  ControlInterface *local_f38;
  string local_f30;
  _Storage<unsigned_long,_true> local_f10;
  byte local_f08;
  TargetCalculator<1UL,_ruckig::StandardVector> *local_f00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ef8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ed8;
  Container<double> *local_eb8;
  double local_eb0;
  string local_ea8;
  string local_e88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e68;
  Profile local_e48 [6];
  
  *was_interrupted = false;
  local_eb0 = delta_time;
  std::vector<std::array<ruckig::Profile,_1UL>,_std::allocator<std::array<ruckig::Profile,_1UL>_>_>
  ::resize(&traj->profiles,1);
  local_eb8 = &traj->cumulative_times;
  std::vector<double,_std::allocator<double>_>::resize(local_eb8,1);
  uVar35 = this->degrees_of_freedom;
  if (uVar35 == 0) {
    bVar38 = inp->duration_discretization == Discrete;
    bVar27 = (inp->minimum_duration).super__Optional_base<double,_true,_true>._M_payload.
             super__Optional_payload_base<double>._M_engaged;
  }
  else {
    local_f38 = &inp->control_interface;
    lVar28 = 0x19c;
    lVar25 = 0x1a4;
    lVar33 = 0;
    lVar24 = 0;
    uVar32 = 0;
    local_f00 = this;
    do {
      if ((inp->min_velocity).super__Optional_base<std::array<double,_1UL>,_true,_true>._M_payload.
          super__Optional_payload_base<std::array<double,_1UL>_>._M_engaged == true) {
        dVar39 = (&inp->max_jerk)[uVar32 + 1]._M_elems[0];
      }
      else {
        dVar39 = -(&inp->max_velocity)[uVar32]._M_elems[0];
      }
      paVar36 = (traj->profiles).
                super__Vector_base<std::array<ruckig::Profile,_1UL>,_std::allocator<std::array<ruckig::Profile,_1UL>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      (&this->inp_min_velocity)[uVar32]._M_elems[0] = dVar39;
      if ((inp->min_acceleration).super__Optional_base<std::array<double,_1UL>,_true,_true>.
          _M_payload.super__Optional_payload_base<std::array<double,_1UL>_>._M_engaged == true) {
        dVar42 = (&inp->max_jerk)[uVar32 + 3]._M_elems[0];
      }
      else {
        dVar42 = -(&inp->max_acceleration)[uVar32]._M_elems[0];
      }
      (&this->inp_min_acceleration)[uVar32]._M_elems[0] = dVar42;
      pCVar20 = (ControlInterface *)
                ((long)&((InputParameter<1UL,_ruckig::StandardVector> *)
                        (&inp->current_position + -3))->degrees_of_freedom + lVar28);
      if ((inp->per_dof_control_interface).
          super__Optional_base<std::array<ruckig::ControlInterface,_1UL>,_true,_true>._M_payload.
          super__Optional_payload_base<std::array<ruckig::ControlInterface,_1UL>_>._M_engaged ==
          false) {
        pCVar20 = local_f38;
      }
      CVar7 = *pCVar20;
      (&this->inp_per_dof_control_interface)[uVar32]._M_elems[0] = CVar7;
      pSVar16 = (Synchronization *)
                ((long)&((InputParameter<1UL,_ruckig::StandardVector> *)
                        (&inp->current_position + -3))->degrees_of_freedom + lVar25);
      if ((inp->per_dof_synchronization).
          super__Optional_base<std::array<ruckig::Synchronization,_1UL>,_true,_true>._M_payload.
          super__Optional_payload_base<std::array<ruckig::Synchronization,_1UL>_>._M_engaged ==
          false) {
        pSVar16 = &inp->synchronization;
      }
      (&this->inp_per_dof_synchronization)[uVar32]._M_elems[0] = *pSVar16;
      if ((&inp->enabled)[uVar32]._M_elems[0] == false) {
        *(double *)((long)&paVar36->_M_elems[0].p + lVar24 + 0x38U) =
             (&inp->current_position)[uVar32]._M_elems[0];
        *(double *)((long)&paVar36->_M_elems[0].v + lVar24 + 0x38U) =
             (&inp->current_velocity)[uVar32]._M_elems[0];
        *(double *)((long)&paVar36->_M_elems[0].a + lVar24 + 0x38U) =
             (&inp->current_acceleration)[uVar32]._M_elems[0];
        *(undefined8 *)((long)&paVar36->_M_elems[0].t_sum + lVar24 + 0x30U) = 0;
        *(undefined8 *)((long)&(this->blocks)._M_elems[0].t_min + lVar33 * 4) = 0;
        if (*(char *)((long)&(this->blocks)._M_elems[0].a.
                             super__Optional_base<ruckig::Block::Interval,_true,_true>._M_payload.
                             super__Optional_payload_base<ruckig::Block::Interval>._M_engaged +
                     lVar33 * 4) == '\x01') {
          *(undefined1 *)
           ((long)&(this->blocks)._M_elems[0].a.
                   super__Optional_base<ruckig::Block::Interval,_true,_true>._M_payload.
                   super__Optional_payload_base<ruckig::Block::Interval>._M_engaged + lVar33 * 4) =
               0;
        }
        if (*(bool *)((long)(&this->inp_min_velocity + -1) + lVar33 * 4) == true) {
          *(bool *)((long)(&this->inp_min_velocity + -1) + lVar33 * 4) = false;
        }
      }
      else {
        if (CVar7 == Velocity) {
          dVar39 = (&inp->max_jerk)[uVar32]._M_elems[0];
          if (ABS(dVar39) == INFINITY) {
            ruckig::BrakeProfile::get_second_order_velocity_brake_trajectory();
          }
          else {
            ruckig::BrakeProfile::get_velocity_brake_trajectory
                      ((&inp->current_acceleration)[uVar32]._M_elems[0],
                       (&inp->max_acceleration)[uVar32]._M_elems[0],dVar42,dVar39);
          }
          dVar6 = (&inp->current_position)[uVar32]._M_elems[0];
          dVar39 = (&inp->current_velocity)[uVar32]._M_elems[0];
          dVar42 = (&inp->current_acceleration)[uVar32]._M_elems[0];
          dVar41 = (&inp->target_velocity)[uVar32]._M_elems[0];
          dVar40 = (&inp->target_acceleration)[uVar32]._M_elems[0];
          lVar15 = 0x220;
          lVar21 = 0x228;
          lVar23 = 0x128;
          lVar29 = 0xe8;
          lVar31 = 0xa8;
          this = local_f00;
LAB_00151637:
          *(double *)((long)&paVar36->_M_elems[0].t + lVar24 + lVar31) = dVar42;
          *(double *)((long)&paVar36->_M_elems[0].t + lVar24 + lVar29) = dVar39;
          *(double *)((long)&paVar36->_M_elems[0].t + lVar24 + lVar23) = dVar6;
          *(double *)((long)&paVar36->_M_elems[0].t + lVar24 + lVar21) = dVar40;
          *(double *)((long)&paVar36->_M_elems[0].t + lVar24 + lVar15) = dVar41;
        }
        else if (CVar7 == Position) {
          dVar41 = (&inp->max_jerk)[uVar32]._M_elems[0];
          if (ABS(dVar41) == INFINITY) {
            dVar41 = (&inp->max_acceleration)[uVar32]._M_elems[0];
            if (ABS(dVar41) != INFINITY) {
              ruckig::BrakeProfile::get_second_order_position_brake_trajectory
                        ((&inp->current_velocity)[uVar32]._M_elems[0],
                         (&inp->max_velocity)[uVar32]._M_elems[0],dVar39,dVar41,dVar42);
            }
          }
          else {
            ruckig::BrakeProfile::get_position_brake_trajectory
                      ((&inp->current_velocity)[uVar32]._M_elems[0],
                       (&inp->current_acceleration)[uVar32]._M_elems[0],
                       (&inp->max_velocity)[uVar32]._M_elems[0],dVar39,
                       (&inp->max_acceleration)[uVar32]._M_elems[0],dVar42,dVar41);
          }
          dVar39 = (&inp->current_position)[uVar32]._M_elems[0];
          dVar42 = (&inp->current_velocity)[uVar32]._M_elems[0];
          dVar41 = (&inp->target_position)[uVar32]._M_elems[0];
          dVar40 = (&inp->target_velocity)[uVar32]._M_elems[0];
          dVar6 = (&inp->target_acceleration)[uVar32]._M_elems[0];
          *(double *)((long)&paVar36->_M_elems[0].a + lVar24) =
               (&inp->current_acceleration)[uVar32]._M_elems[0];
          lVar15 = 0x218;
          lVar21 = 0x220;
          lVar23 = 0x228;
          lVar29 = 0x128;
          lVar31 = 0xe8;
          goto LAB_00151637;
        }
        if (ABS((&inp->max_jerk)[uVar32]._M_elems[0]) == INFINITY) {
          if (ABS((&inp->max_acceleration)[uVar32]._M_elems[0]) != INFINITY) {
            BrakeProfile::finalize_second_order
                      ((BrakeProfile *)((long)&paVar36->_M_elems[0].brake + lVar24),
                       (double *)((long)&paVar36->_M_elems[0].p + lVar24),
                       (double *)((long)&paVar36->_M_elems[0].v + lVar24),
                       (double *)((long)&paVar36->_M_elems[0].a + lVar24));
          }
        }
        else {
          BrakeProfile::finalize
                    ((BrakeProfile *)((long)&paVar36->_M_elems[0].brake + lVar24),
                     (double *)((long)&paVar36->_M_elems[0].p + lVar24),
                     (double *)((long)&paVar36->_M_elems[0].v + lVar24),
                     (double *)((long)&paVar36->_M_elems[0].a + lVar24));
        }
        pBVar3 = (Block *)((long)&paVar36->_M_elems[0].t + lVar24);
        CVar7 = (&this->inp_per_dof_control_interface)[uVar32]._M_elems[0];
        if (CVar7 == Velocity) {
          dVar39 = (&inp->max_jerk)[uVar32]._M_elems[0];
          if (ABS(dVar39) == INFINITY) {
            local_f40 = pBVar3;
            ruckig::VelocitySecondOrderStep1::VelocitySecondOrderStep1
                      ((VelocitySecondOrderStep1 *)local_e48,
                       *(double *)((long)&paVar36->_M_elems[0].v + lVar24),
                       *(double *)((long)&paVar36->_M_elems[0].accel + lVar24 + 0x60U),
                       (&inp->max_acceleration)[uVar32]._M_elems[0],
                       (&this->inp_min_acceleration)[uVar32]._M_elems[0]);
            cVar13 = ruckig::VelocitySecondOrderStep1::get_profile(local_e48,local_f40);
          }
          else {
            local_f40 = pBVar3;
            ruckig::VelocityThirdOrderStep1::VelocityThirdOrderStep1
                      ((VelocityThirdOrderStep1 *)local_e48,
                       *(double *)((long)&paVar36->_M_elems[0].v + lVar24),
                       *(double *)((long)&paVar36->_M_elems[0].a + lVar24),
                       *(double *)((long)&paVar36->_M_elems[0].accel + lVar24 + 0x60U),
                       *(double *)((long)&paVar36->_M_elems[0].accel + lVar24 + 0x68U),
                       (&inp->max_acceleration)[uVar32]._M_elems[0],
                       (&this->inp_min_acceleration)[uVar32]._M_elems[0],dVar39);
            cVar13 = ruckig::VelocityThirdOrderStep1::get_profile(local_e48,local_f40);
          }
        }
        else {
          if (CVar7 != Position) goto LAB_001525bf;
          dVar39 = (&inp->max_jerk)[uVar32]._M_elems[0];
          if (ABS(dVar39) == INFINITY) {
            dVar39 = (&inp->max_acceleration)[uVar32]._M_elems[0];
            if (ABS(dVar39) == INFINITY) {
              local_f40 = pBVar3;
              ruckig::PositionFirstOrderStep1::PositionFirstOrderStep1
                        ((PositionFirstOrderStep1 *)local_e48,
                         *(double *)((long)&paVar36->_M_elems[0].p + lVar24),
                         *(double *)((long)&paVar36->_M_elems[0].accel + lVar24 + 0x58U),
                         (&inp->max_velocity)[uVar32]._M_elems[0],
                         (&this->inp_min_velocity)[uVar32]._M_elems[0]);
              cVar13 = ruckig::PositionFirstOrderStep1::get_profile(local_e48,local_f40);
            }
            else {
              local_f40 = pBVar3;
              ruckig::PositionSecondOrderStep1::PositionSecondOrderStep1
                        ((PositionSecondOrderStep1 *)local_e48,
                         *(double *)((long)&paVar36->_M_elems[0].p + lVar24),
                         *(double *)((long)&paVar36->_M_elems[0].v + lVar24),
                         *(double *)((long)&paVar36->_M_elems[0].accel + lVar24 + 0x58U),
                         *(double *)((long)&paVar36->_M_elems[0].accel + lVar24 + 0x60U),
                         (&inp->max_velocity)[uVar32]._M_elems[0],
                         (&this->inp_min_velocity)[uVar32]._M_elems[0],dVar39,
                         (&this->inp_min_acceleration)[uVar32]._M_elems[0]);
              cVar13 = ruckig::PositionSecondOrderStep1::get_profile(local_e48,local_f40);
            }
          }
          else {
            ruckig::PositionThirdOrderStep1::PositionThirdOrderStep1
                      ((PositionThirdOrderStep1 *)local_e48,
                       *(double *)((long)&paVar36->_M_elems[0].p + lVar24),
                       *(double *)((long)&paVar36->_M_elems[0].v + lVar24),
                       *(double *)((long)&paVar36->_M_elems[0].a + lVar24),
                       *(double *)((long)&paVar36->_M_elems[0].accel + lVar24 + 0x58U),
                       *(double *)((long)&paVar36->_M_elems[0].accel + lVar24 + 0x60U),
                       *(double *)((long)&paVar36->_M_elems[0].accel + lVar24 + 0x68U),
                       (&inp->max_velocity)[uVar32]._M_elems[0],
                       (&this->inp_min_velocity)[uVar32]._M_elems[0],
                       (&inp->max_acceleration)[uVar32]._M_elems[0],
                       (&this->inp_min_acceleration)[uVar32]._M_elems[0],dVar39);
            cVar13 = ruckig::PositionThirdOrderStep1::get_profile(local_e48,pBVar3);
          }
        }
        if (cVar13 == '\0') {
LAB_001525bf:
          dVar39 = (&inp->max_acceleration)[uVar32]._M_elems[0];
          if ((((dVar39 != 0.0) || (NAN(dVar39))) &&
              ((dVar39 = (&local_f00->inp_min_acceleration)[uVar32]._M_elems[0], dVar39 != 0.0 ||
               (NAN(dVar39))))) &&
             ((dVar39 = (&inp->max_jerk)[uVar32]._M_elems[0], dVar39 != 0.0 || (NAN(dVar39))))) {
            pRVar17 = (RuckigError *)__cxa_allocate_exception(0x10);
            std::__cxx11::to_string(&local_f30,uVar32);
            std::operator+(&local_ed8,"error in step 1, dof: ",&local_f30);
            plVar18 = (long *)std::__cxx11::string::append((char *)&local_ed8);
            local_f60._M_dataplus._M_p = (pointer)*plVar18;
            psVar22 = (size_type *)(plVar18 + 2);
            if ((size_type *)local_f60._M_dataplus._M_p == psVar22) {
              local_f60.field_2._M_allocated_capacity = *psVar22;
              local_f60.field_2._8_8_ = plVar18[3];
              local_f60._M_dataplus._M_p = (pointer)&local_f60.field_2;
            }
            else {
              local_f60.field_2._M_allocated_capacity = *psVar22;
            }
            local_f60._M_string_length = plVar18[1];
            *plVar18 = (long)psVar22;
            plVar18[1] = 0;
            *(undefined1 *)(plVar18 + 2) = 0;
            InputParameter<1ul,ruckig::StandardVector>::to_string_abi_cxx11_(&local_ef8,inp);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_e48,&local_f60,&local_ef8);
            RuckigError::RuckigError(pRVar17,(string *)local_e48);
            __cxa_throw(pRVar17,&RuckigError::typeinfo,std::runtime_error::~runtime_error);
          }
          pRVar17 = (RuckigError *)__cxa_allocate_exception(0x10);
          std::__cxx11::to_string(&local_f30,uVar32);
          std::operator+(&local_ed8,"zero limits conflict in step 1, dof: ",&local_f30);
          plVar18 = (long *)std::__cxx11::string::append((char *)&local_ed8);
          local_f60._M_dataplus._M_p = (pointer)*plVar18;
          psVar22 = (size_type *)(plVar18 + 2);
          if ((size_type *)local_f60._M_dataplus._M_p == psVar22) {
            local_f60.field_2._M_allocated_capacity = *psVar22;
            local_f60.field_2._8_8_ = plVar18[3];
            local_f60._M_dataplus._M_p = (pointer)&local_f60.field_2;
          }
          else {
            local_f60.field_2._M_allocated_capacity = *psVar22;
          }
          local_f60._M_string_length = plVar18[1];
          *plVar18 = (long)psVar22;
          plVar18[1] = 0;
          *(undefined1 *)(plVar18 + 2) = 0;
          InputParameter<1ul,ruckig::StandardVector>::to_string_abi_cxx11_(&local_ef8,inp);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_e48,&local_f60,&local_ef8);
          RuckigError::RuckigError(pRVar17,(string *)local_e48);
          __cxa_throw(pRVar17,&RuckigError::typeinfo,std::runtime_error::~runtime_error);
        }
        (&traj->independent_min_durations)[uVar32]._M_elems[0] =
             *(double *)((long)&(this->blocks)._M_elems[0].t_min + lVar33 * 4);
        uVar35 = this->degrees_of_freedom;
      }
      uVar32 = uVar32 + 1;
      lVar24 = lVar24 + 0x240;
      lVar28 = lVar28 + 4;
      lVar25 = lVar25 + 4;
      lVar33 = lVar33 + 0x1be;
    } while (uVar32 < uVar35);
    bVar38 = inp->duration_discretization == Discrete;
    bVar27 = (inp->minimum_duration).super__Optional_base<double,_true,_true>._M_payload.
             super__Optional_payload_base<double>._M_engaged;
    if ((uVar35 == 1 && (bVar27 & 1) == 0) && !bVar38) {
      traj->duration = (this->blocks)._M_elems[0].t_min;
      memcpy((traj->profiles).
             super__Vector_base<std::array<ruckig::Profile,_1UL>,_std::allocator<std::array<ruckig::Profile,_1UL>_>_>
             ._M_impl.super__Vector_impl_data._M_start,&this->blocks,0x23c);
      *(traj->cumulative_times).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_start = traj->duration;
      return Working;
    }
  }
  local_f08 = 0;
  t_sync = &traj->duration;
  t_min.super__Optional_base<double,_true,_true>._M_payload.super__Optional_payload_base<double>.
  _M_engaged = (bool)bVar27;
  t_min.super__Optional_base<double,_true,_true>._M_payload.super__Optional_payload_base<double>.
  _M_payload = (inp->minimum_duration).super__Optional_base<double,_true,_true>._M_payload.
               super__Optional_payload_base<double>._M_payload;
  t_min.super__Optional_base<double,_true,_true>._M_payload.super__Optional_payload_base<double>.
  _9_7_ = 0;
  bVar14 = synchronize(this,t_min,t_sync,(optional<unsigned_long> *)&local_f10,
                       (traj->profiles).
                       super__Vector_base<std::array<ruckig::Profile,_1UL>,_std::allocator<std::array<ruckig::Profile,_1UL>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,bVar38,local_eb0);
  sVar10 = this->degrees_of_freedom;
  if (!bVar14) {
    if (sVar10 != 0) {
      sVar19 = 0;
      do {
        dVar39 = (&inp->max_acceleration)[sVar19]._M_elems[0];
        if ((((dVar39 == 0.0) && (!NAN(dVar39))) ||
            ((dVar39 = (&this->inp_min_acceleration)[sVar19]._M_elems[0], dVar39 == 0.0 &&
             (!NAN(dVar39))))) ||
           ((dVar39 = (&inp->max_jerk)[sVar19]._M_elems[0], dVar39 == 0.0 && (!NAN(dVar39))))) {
          pRVar17 = (RuckigError *)__cxa_allocate_exception(0x10);
          __gnu_cxx::__to_xstring<std::__cxx11::string,char>
                    (&local_f60,vsnprintf,0x148,"%f",*t_sync);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_e48,
                         "zero limits conflict with other degrees of freedom in time synchronization "
                         ,&local_f60);
          RuckigError::RuckigError(pRVar17,(string *)local_e48);
          __cxa_throw(pRVar17,&RuckigError::typeinfo,std::runtime_error::~runtime_error);
        }
        sVar19 = sVar19 + 1;
      } while (sVar10 != sVar19);
    }
    pRVar17 = (RuckigError *)__cxa_allocate_exception(0x10);
    __gnu_cxx::__to_xstring<std::__cxx11::string,char>(&local_f60,vsnprintf,0x148,"%f",*t_sync);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e48,
                   "error in time synchronization: ",&local_f60);
    RuckigError::RuckigError(pRVar17,(string *)local_e48);
    __cxa_throw(pRVar17,&RuckigError::typeinfo,std::runtime_error::~runtime_error);
  }
  psVar1 = &this->degrees_of_freedom;
  local_f38 = (ControlInterface *)CONCAT71(local_f38._1_7_,bVar38);
  if (sVar10 == 0) {
    uVar35 = 0;
  }
  else {
    pSVar30 = &this->blocks;
    lVar24 = 0;
    _Var34._M_value = 0;
    do {
      if (((&inp->enabled)[_Var34._M_value]._M_elems[0] == true) &&
         ((&this->inp_per_dof_synchronization)[_Var34._M_value]._M_elems[0] == None)) {
        memcpy((void *)((long)&((traj->profiles).
                                super__Vector_base<std::array<ruckig::Profile,_1UL>,_std::allocator<std::array<ruckig::Profile,_1UL>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->_M_elems[0].t + lVar24),
               pSVar30,0x23c);
        dVar39 = pSVar30->_M_elems[0].t_min;
        if (traj->duration <= dVar39 && dVar39 != traj->duration) {
          *t_sync = dVar39;
          local_f08 = 1;
          local_f10 = _Var34;
        }
      }
      _Var34._M_value = _Var34._M_value + 1;
      uVar35 = *psVar1;
      lVar24 = lVar24 + 0x240;
      pSVar30 = pSVar30 + 1;
    } while (_Var34._M_value < uVar35);
  }
  _Var34 = local_f10;
  dVar39 = *t_sync;
  *(local_eb8->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
   _M_start = dVar39;
  if (7600.0 < dVar39) {
    return ErrorTrajectoryDuration;
  }
  if ((dVar39 == 0.0) && (!NAN(dVar39))) {
    if (uVar35 == 0) {
      return Working;
    }
    pSVar30 = &this->blocks;
    lVar24 = 0;
    uVar35 = 0;
    do {
      memcpy((void *)((long)&((traj->profiles).
                              super__Vector_base<std::array<ruckig::Profile,_1UL>,_std::allocator<std::array<ruckig::Profile,_1UL>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->_M_elems[0].t + lVar24),
             pSVar30,0x23c);
      uVar35 = uVar35 + 1;
      pSVar30 = pSVar30 + 1;
      lVar24 = lVar24 + 0x240;
    } while (uVar35 < *psVar1);
    return Working;
  }
  SVar8 = (this->inp_per_dof_synchronization)._M_elems[0];
  if ((SVar8 != None | (byte)local_f38) != 1) {
    return Working;
  }
  pSVar2 = &this->inp_per_dof_synchronization;
  if ((SVar8 == Phase & local_f08) == 1) {
    paVar36 = (traj->profiles).
              super__Vector_base<std::array<ruckig::Profile,_1UL>,_std::allocator<std::array<ruckig::Profile,_1UL>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    bVar38 = is_input_collinear(this,inp,paVar36[local_f10._M_value]._M_elems[0].direction,
                                local_f10._M_value);
    uVar35 = this->degrees_of_freedom;
    if (bVar38) {
      if (uVar35 != 0) {
        paVar36 = paVar36 + _Var34._M_value;
        bVar27 = 1;
        lVar24 = 0;
        uVar26 = 0;
        do {
          if (((&inp->enabled)[uVar26]._M_elems[0] == true) &&
             (((local_f08 != 1 || (uVar26 != local_f10._M_value)) &&
              ((&this->inp_per_dof_synchronization)[uVar26]._M_elems[0] == Phase)))) {
            paVar11 = (traj->profiles).
                      super__Vector_base<std::array<ruckig::Profile,_1UL>,_std::allocator<std::array<ruckig::Profile,_1UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            this_00 = (Profile *)((long)&paVar11->_M_elems[0].t + lVar24);
            *(double *)((long)&paVar11->_M_elems[0].t + lVar24 + 0x30) =
                 *(double *)((long)&paVar36->_M_elems[0].t + 0x30);
            uVar12 = paVar36->_M_elems[0].t._M_elems[0];
            dVar40 = *(double *)((long)&paVar36->_M_elems[0].t + 8);
            dVar42 = *(double *)((long)&paVar36->_M_elems[0].t + 0x10);
            dVar41 = *(double *)((long)&paVar36->_M_elems[0].t + 0x18);
            dVar39 = *(double *)((long)&paVar36->_M_elems[0].t + 0x28);
            pdVar5 = (double *)((long)&paVar11->_M_elems[0].t + lVar24 + 0x20);
            *pdVar5 = *(double *)((long)&paVar36->_M_elems[0].t + 0x20);
            pdVar5[1] = dVar39;
            pdVar5 = (double *)((long)&paVar11->_M_elems[0].t + lVar24 + 0x10);
            *pdVar5 = dVar42;
            pdVar5[1] = dVar41;
            puVar4 = (undefined8 *)((long)&paVar11->_M_elems[0].t + lVar24);
            *puVar4 = uVar12;
            puVar4[1] = dVar40;
            CVar9 = paVar36->_M_elems[0].control_signs;
            *(ControlSigns *)((long)&paVar11->_M_elems[0].accel + lVar24 + 0x78U) = CVar9;
            CVar7 = (&this->inp_per_dof_control_interface)[uVar26]._M_elems[0];
            if (CVar7 == Velocity) {
              if (CVar9 == UDUD) {
                dVar39 = (&inp->max_jerk)[uVar26]._M_elems[0];
                dVar42 = (&this->new_phase_control)[uVar26]._M_elems[0];
                if (ABS(dVar39) == INFINITY) {
                  bVar38 = false;
                  if ((dVar42 < (&inp->max_acceleration)[uVar26]._M_elems[0] + 1e-12) &&
                     ((&this->inp_min_acceleration)[uVar26]._M_elems[0] + -1e-12 < dVar42)) {
                    bVar38 = Profile::
                             check_for_second_order_velocity<(ruckig::Profile::ControlSigns)1,(ruckig::Profile::ReachedLimits)7>
                                       (this_00,dVar42);
                  }
                }
                else {
                  if (ABS(dVar39) + 1e-12 <= ABS(dVar42)) goto LAB_0015207d;
                  bVar38 = Profile::
                           check_for_velocity<(ruckig::Profile::ControlSigns)1,(ruckig::Profile::ReachedLimits)7>
                                     (this_00,dVar42,(&inp->max_acceleration)[uVar26]._M_elems[0],
                                      (&this->inp_min_acceleration)[uVar26]._M_elems[0]);
                }
              }
              else {
                if (CVar9 != UDDU) goto LAB_00152082;
                dVar39 = (&inp->max_jerk)[uVar26]._M_elems[0];
                dVar42 = (&this->new_phase_control)[uVar26]._M_elems[0];
                if (ABS(dVar39) == INFINITY) {
                  bVar38 = false;
                  if ((dVar42 < (&inp->max_acceleration)[uVar26]._M_elems[0] + 1e-12) &&
                     ((&this->inp_min_acceleration)[uVar26]._M_elems[0] + -1e-12 < dVar42)) {
                    bVar38 = Profile::
                             check_for_second_order_velocity<(ruckig::Profile::ControlSigns)0,(ruckig::Profile::ReachedLimits)7>
                                       (this_00,dVar42);
                  }
                }
                else {
                  if (ABS(dVar39) + 1e-12 <= ABS(dVar42)) goto LAB_0015207d;
                  bVar38 = Profile::
                           check_for_velocity<(ruckig::Profile::ControlSigns)0,(ruckig::Profile::ReachedLimits)7>
                                     (this_00,dVar42,(&inp->max_acceleration)[uVar26]._M_elems[0],
                                      (&this->inp_min_acceleration)[uVar26]._M_elems[0]);
                }
              }
              goto LAB_0015207f;
            }
            if (CVar7 == Position) {
              if (CVar9 == UDUD) {
                dVar39 = (&inp->max_jerk)[uVar26]._M_elems[0];
                dVar42 = (&this->new_phase_control)[uVar26]._M_elems[0];
                if (ABS(dVar39) == INFINITY) {
                  dVar39 = (&this->inp_min_acceleration)[uVar26]._M_elems[0] + -1e-12;
                  if (dVar42 <= dVar39) {
LAB_0015207d:
                    bVar38 = false;
                  }
                  else {
                    dVar41 = -dVar42;
                    dVar40 = (&inp->max_acceleration)[uVar26]._M_elems[0] + 1e-12;
                    bVar38 = false;
                    if (((dVar41 < dVar40) && (dVar39 < dVar41)) && (dVar42 < dVar40)) {
                      bVar38 = Profile::
                               check_for_second_order<(ruckig::Profile::ControlSigns)1,(ruckig::Profile::ReachedLimits)7>
                                         (this_00,dVar42,dVar41,
                                          (&inp->max_velocity)[uVar26]._M_elems[0],
                                          (&this->inp_min_velocity)[uVar26]._M_elems[0]);
                    }
                  }
                }
                else {
                  if (ABS(dVar39) + 1e-12 <= ABS(dVar42)) goto LAB_0015207d;
                  bVar38 = Profile::
                           check<(ruckig::Profile::ControlSigns)1,(ruckig::Profile::ReachedLimits)7,false>
                                     (this_00,dVar42,(&inp->max_velocity)[uVar26]._M_elems[0],
                                      (&this->inp_min_velocity)[uVar26]._M_elems[0],
                                      (&inp->max_acceleration)[uVar26]._M_elems[0],
                                      (&this->inp_min_acceleration)[uVar26]._M_elems[0]);
                }
LAB_0015207f:
                bVar27 = bVar27 & bVar38;
              }
              else if (CVar9 == UDDU) {
                dVar39 = (&inp->max_jerk)[uVar26]._M_elems[0];
                if (ABS(dVar39) == INFINITY) {
                  dVar39 = (&inp->max_acceleration)[uVar26]._M_elems[0];
                  dVar42 = (&this->new_phase_control)[uVar26]._M_elems[0];
                  if (ABS(dVar39) == INFINITY) {
                    bVar38 = false;
                    if ((dVar42 < (&inp->max_velocity)[uVar26]._M_elems[0] + 1e-12) &&
                       ((&this->inp_min_velocity)[uVar26]._M_elems[0] + -1e-12 < dVar42)) {
                      bVar38 = Profile::
                               check_for_first_order<(ruckig::Profile::ControlSigns)0,(ruckig::Profile::ReachedLimits)7>
                                         (this_00,dVar42);
                    }
                  }
                  else {
                    dVar41 = (&this->inp_min_acceleration)[uVar26]._M_elems[0] + -1e-12;
                    if (dVar42 <= dVar41) goto LAB_0015207d;
                    dVar40 = -dVar42;
                    dVar39 = dVar39 + 1e-12;
                    bVar38 = false;
                    if (((dVar40 < dVar39) && (dVar42 < dVar39)) && (dVar41 < dVar40)) {
                      bVar38 = Profile::
                               check_for_second_order<(ruckig::Profile::ControlSigns)0,(ruckig::Profile::ReachedLimits)7>
                                         (this_00,dVar42,dVar40,
                                          (&inp->max_velocity)[uVar26]._M_elems[0],
                                          (&this->inp_min_velocity)[uVar26]._M_elems[0]);
                    }
                  }
                }
                else {
                  dVar42 = (&this->new_phase_control)[uVar26]._M_elems[0];
                  if (ABS(dVar39) + 1e-12 <= ABS(dVar42)) goto LAB_0015207d;
                  bVar38 = Profile::
                           check<(ruckig::Profile::ControlSigns)0,(ruckig::Profile::ReachedLimits)7,false>
                                     (this_00,dVar42,(&inp->max_velocity)[uVar26]._M_elems[0],
                                      (&this->inp_min_velocity)[uVar26]._M_elems[0],
                                      (&inp->max_acceleration)[uVar26]._M_elems[0],
                                      (&this->inp_min_acceleration)[uVar26]._M_elems[0]);
                }
                goto LAB_0015207f;
              }
            }
LAB_00152082:
            *(ReachedLimits *)((long)&paVar11->_M_elems[0].accel + lVar24 + 0x70U) =
                 paVar36->_M_elems[0].limits;
            uVar35 = *psVar1;
          }
          uVar26 = uVar26 + 1;
          lVar24 = lVar24 + 0x240;
        } while (uVar26 < uVar35);
        if (bVar27 == 0) goto joined_r0x001520ea;
      }
      pSVar16 = std::
                __find_if<ruckig::Synchronization*,__gnu_cxx::__ops::_Iter_negate<ruckig::TargetCalculator<1ul,ruckig::StandardVector>::calculate<true>(ruckig::InputParameter<1ul,ruckig::StandardVector>const&,ruckig::Trajectory<1ul,ruckig::StandardVector>&,double,bool&)::_lambda(ruckig::Synchronization)_3_>>
                          (pSVar2,psVar1);
      if (pSVar16 == (Synchronization *)psVar1) {
        return Working;
      }
      uVar35 = *psVar1;
    }
  }
joined_r0x001520ea:
  if (uVar35 == 0) {
    return Working;
  }
  pbVar37 = &(this->blocks)._M_elems[0].b.super__Optional_base<ruckig::Block::Interval,_true,_true>.
             _M_payload.super__Optional_payload_base<ruckig::Block::Interval>._M_engaged;
  lVar24 = 0;
  uVar32 = 0;
  do {
    if (((local_f08 == 1) && (uVar32 == local_f10._M_value)) ||
       (cVar13 = '\x01', pSVar2[uVar32]._M_elems[0] == None)) {
      cVar13 = (byte)local_f38;
    }
    if ((cVar13 != '\0') && ((&inp->enabled)[uVar32]._M_elems[0] != false)) {
      paVar36 = (traj->profiles).
                super__Vector_base<std::array<ruckig::Profile,_1UL>,_std::allocator<std::array<ruckig::Profile,_1UL>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      dVar39 = (traj->duration - *(double *)((long)&paVar36->_M_elems[0].brake + lVar24)) -
               *(double *)((long)&paVar36->_M_elems[0].accel + lVar24);
      if ((pSVar2[uVar32]._M_elems[0] != TimeIfNecessary) ||
         ((2.220446049250313e-16 <= ABS((&inp->target_velocity)[uVar32]._M_elems[0]) ||
          (2.220446049250313e-16 <= ABS((&inp->target_acceleration)[uVar32]._M_elems[0]))))) {
        if (4.440892098500626e-16 <= ABS(dVar39 - *(double *)(pbVar37 + -0x4b0))) {
          if ((pbVar37[-600] != true) ||
             (4.440892098500626e-16 <= ABS(dVar39 - *(double *)(pbVar37 + -0x4a0)))) {
            if ((*pbVar37 != true) ||
               (4.440892098500626e-16 <= ABS(dVar39 - *(double *)(pbVar37 + -0x248)))) {
              CVar7 = (&this->inp_per_dof_control_interface)[uVar32]._M_elems[0];
              if (CVar7 == Velocity) {
                dVar42 = (&inp->max_jerk)[uVar32]._M_elems[0];
                if (ABS(dVar42) == INFINITY) {
                  ruckig::VelocitySecondOrderStep2::VelocitySecondOrderStep2
                            ((VelocitySecondOrderStep2 *)local_e48,dVar39,
                             *(double *)((long)&paVar36->_M_elems[0].v + lVar24),
                             *(double *)((long)&paVar36->_M_elems[0].accel + lVar24 + 0x60U),
                             (&inp->max_acceleration)[uVar32]._M_elems[0],
                             (&this->inp_min_acceleration)[uVar32]._M_elems[0]);
                  cVar13 = ruckig::VelocitySecondOrderStep2::get_profile(local_e48);
                }
                else {
                  ruckig::VelocityThirdOrderStep2::VelocityThirdOrderStep2
                            ((VelocityThirdOrderStep2 *)local_e48,dVar39,
                             *(double *)((long)&paVar36->_M_elems[0].v + lVar24),
                             *(double *)((long)&paVar36->_M_elems[0].a + lVar24),
                             *(double *)((long)&paVar36->_M_elems[0].accel + lVar24 + 0x60U),
                             *(double *)((long)&paVar36->_M_elems[0].accel + lVar24 + 0x68U),
                             (&inp->max_acceleration)[uVar32]._M_elems[0],
                             (&this->inp_min_acceleration)[uVar32]._M_elems[0],dVar42);
                  cVar13 = ruckig::VelocityThirdOrderStep2::get_profile(local_e48);
                }
              }
              else {
                if (CVar7 != Position) goto LAB_0015252f;
                dVar42 = (&inp->max_jerk)[uVar32]._M_elems[0];
                if (ABS(dVar42) == INFINITY) {
                  dVar42 = (&inp->max_acceleration)[uVar32]._M_elems[0];
                  if (ABS(dVar42) == INFINITY) {
                    ruckig::PositionFirstOrderStep2::PositionFirstOrderStep2
                              ((PositionFirstOrderStep2 *)local_e48,dVar39,
                               *(double *)((long)&paVar36->_M_elems[0].p + lVar24),
                               *(double *)((long)&paVar36->_M_elems[0].accel + lVar24 + 0x58U),
                               (&inp->max_velocity)[uVar32]._M_elems[0],
                               (&this->inp_min_velocity)[uVar32]._M_elems[0]);
                    cVar13 = ruckig::PositionFirstOrderStep2::get_profile(local_e48);
                  }
                  else {
                    ruckig::PositionSecondOrderStep2::PositionSecondOrderStep2
                              ((PositionSecondOrderStep2 *)local_e48,dVar39,
                               *(double *)((long)&paVar36->_M_elems[0].p + lVar24),
                               *(double *)((long)&paVar36->_M_elems[0].v + lVar24),
                               *(double *)((long)&paVar36->_M_elems[0].accel + lVar24 + 0x58U),
                               *(double *)((long)&paVar36->_M_elems[0].accel + lVar24 + 0x60U),
                               (&inp->max_velocity)[uVar32]._M_elems[0],
                               (&this->inp_min_velocity)[uVar32]._M_elems[0],dVar42,
                               (&this->inp_min_acceleration)[uVar32]._M_elems[0]);
                    cVar13 = ruckig::PositionSecondOrderStep2::get_profile(local_e48);
                  }
                }
                else {
                  ruckig::PositionThirdOrderStep2::PositionThirdOrderStep2
                            ((PositionThirdOrderStep2 *)local_e48,dVar39,
                             *(double *)((long)&paVar36->_M_elems[0].p + lVar24),
                             *(double *)((long)&paVar36->_M_elems[0].v + lVar24),
                             *(double *)((long)&paVar36->_M_elems[0].a + lVar24),
                             *(double *)((long)&paVar36->_M_elems[0].accel + lVar24 + 0x58U),
                             *(double *)((long)&paVar36->_M_elems[0].accel + lVar24 + 0x60U),
                             *(double *)((long)&paVar36->_M_elems[0].accel + lVar24 + 0x68U),
                             (&inp->max_velocity)[uVar32]._M_elems[0],
                             (&this->inp_min_velocity)[uVar32]._M_elems[0],
                             (&inp->max_acceleration)[uVar32]._M_elems[0],
                             (&this->inp_min_acceleration)[uVar32]._M_elems[0],dVar42);
                  cVar13 = ruckig::PositionThirdOrderStep2::get_profile(local_e48);
                }
              }
              if (cVar13 == '\0') {
LAB_0015252f:
                pRVar17 = (RuckigError *)__cxa_allocate_exception(0x10);
                std::__cxx11::to_string(&local_ea8,uVar32);
                std::operator+(&local_ef8,"error in step 2 in dof: ",&local_ea8);
                plVar18 = (long *)std::__cxx11::string::append((char *)&local_ef8);
                local_f30._M_dataplus._M_p = (pointer)*plVar18;
                psVar22 = (size_type *)(plVar18 + 2);
                if ((size_type *)local_f30._M_dataplus._M_p == psVar22) {
                  local_f30.field_2._M_allocated_capacity = *psVar22;
                  local_f30.field_2._8_8_ = plVar18[3];
                  local_f30._M_dataplus._M_p = (pointer)&local_f30.field_2;
                }
                else {
                  local_f30.field_2._M_allocated_capacity = *psVar22;
                }
                local_f30._M_string_length = plVar18[1];
                *plVar18 = (long)psVar22;
                plVar18[1] = 0;
                *(undefined1 *)(plVar18 + 2) = 0;
                __gnu_cxx::__to_xstring<std::__cxx11::string,char>
                          (&local_e68,vsnprintf,0x148,"%f",*t_sync);
                std::operator+(&local_ed8,&local_f30,&local_e68);
                plVar18 = (long *)std::__cxx11::string::append((char *)&local_ed8);
                local_f60._M_dataplus._M_p = (pointer)*plVar18;
                psVar22 = (size_type *)(plVar18 + 2);
                if ((size_type *)local_f60._M_dataplus._M_p == psVar22) {
                  local_f60.field_2._M_allocated_capacity = *psVar22;
                  local_f60.field_2._8_8_ = plVar18[3];
                  local_f60._M_dataplus._M_p = (pointer)&local_f60.field_2;
                }
                else {
                  local_f60.field_2._M_allocated_capacity = *psVar22;
                }
                local_f60._M_string_length = plVar18[1];
                *plVar18 = (long)psVar22;
                plVar18[1] = 0;
                *(undefined1 *)(plVar18 + 2) = 0;
                InputParameter<1ul,ruckig::StandardVector>::to_string_abi_cxx11_(&local_e88,inp);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_e48,&local_f60,&local_e88);
                RuckigError::RuckigError(pRVar17,(string *)local_e48);
                __cxa_throw(pRVar17,&RuckigError::typeinfo,std::runtime_error::~runtime_error);
              }
              goto LAB_00152209;
            }
            pSVar30 = (StandardVector<Block,_1UL> *)
                      ((long)&(&this->blocks)[uVar32]._M_elems[0].b.
                              super__Optional_base<ruckig::Block::Interval,_true,_true>._M_payload.
                              super__Optional_payload_base<ruckig::Block::Interval>._M_payload +
                      0x10);
          }
          else {
            pSVar30 = (StandardVector<Block,_1UL> *)
                      ((long)&(&this->blocks)[uVar32]._M_elems[0].a.
                              super__Optional_base<ruckig::Block::Interval,_true,_true>._M_payload.
                              super__Optional_payload_base<ruckig::Block::Interval>._M_payload +
                      0x10);
          }
        }
        else {
          pSVar30 = (StandardVector<Block,_1UL> *)(pbVar37 + -0x6f0);
        }
      }
      else {
        pSVar30 = &this->blocks + uVar32;
      }
      memcpy((void *)((long)&paVar36->_M_elems[0].t + lVar24),pSVar30,0x23c);
    }
LAB_00152209:
    uVar32 = uVar32 + 1;
    pbVar37 = pbVar37 + 0x6f8;
    lVar24 = lVar24 + 0x240;
    if (*psVar1 <= uVar32) {
      return Working;
    }
  } while( true );
}

Assistant:

Result calculate(const InputParameter<DOFs, CustomVector>& inp, Trajectory<DOFs, CustomVector>& traj, double delta_time, bool& was_interrupted) {
        was_interrupted = false;
#if defined WITH_CLOUD_CLIENT
        traj.resize(0);
#endif

        for (size_t dof = 0; dof < degrees_of_freedom; ++dof) {
            auto& p = traj.profiles[0][dof];

            inp_min_velocity[dof] = inp.min_velocity ? inp.min_velocity.value()[dof] : -inp.max_velocity[dof];
            inp_min_acceleration[dof] = inp.min_acceleration ? inp.min_acceleration.value()[dof] : -inp.max_acceleration[dof];
            inp_per_dof_control_interface[dof] = inp.per_dof_control_interface ? inp.per_dof_control_interface.value()[dof] : inp.control_interface;
            inp_per_dof_synchronization[dof] = inp.per_dof_synchronization ? inp.per_dof_synchronization.value()[dof] : inp.synchronization;

            if (!inp.enabled[dof]) {
                p.p.back() = inp.current_position[dof];
                p.v.back() = inp.current_velocity[dof];
                p.a.back() = inp.current_acceleration[dof];
                p.t_sum.back() = 0.0;
                blocks[dof].t_min = 0.0;
                blocks[dof].a = std::nullopt;
                blocks[dof].b = std::nullopt;
                continue;
            }

            // Calculate brake (if input exceeds or will exceed limits)
            switch (inp_per_dof_control_interface[dof]) {
                case ControlInterface::Position: {
                    if (!std::isinf(inp.max_jerk[dof])) {
                        p.brake.get_position_brake_trajectory(inp.current_velocity[dof], inp.current_acceleration[dof], inp.max_velocity[dof], inp_min_velocity[dof], inp.max_acceleration[dof], inp_min_acceleration[dof], inp.max_jerk[dof]);
                        // p.accel.get_position_brake_trajectory(inp.target_velocity[dof], inp.target_acceleration[dof], inp.max_velocity[dof], inp_min_velocity[dof], inp.max_acceleration[dof], inp_min_acceleration[dof], inp.max_jerk[dof]);
                    } else if (!std::isinf(inp.max_acceleration[dof])) {
                        p.brake.get_second_order_position_brake_trajectory(inp.current_velocity[dof], inp.max_velocity[dof], inp_min_velocity[dof], inp.max_acceleration[dof], inp_min_acceleration[dof]);
                        // p.accel.get_second_order_position_brake_trajectory(inp.target_velocity[dof], inp.target_acceleration[dof], inp.max_velocity[dof], inp_min_velocity[dof], inp.max_acceleration[dof], inp_min_acceleration[dof]);
                    }
                    p.set_boundary(inp.current_position[dof], inp.current_velocity[dof], inp.current_acceleration[dof], inp.target_position[dof], inp.target_velocity[dof], inp.target_acceleration[dof]);
                } break;
                case ControlInterface::Velocity: {
                    if (!std::isinf(inp.max_jerk[dof])) {
                        p.brake.get_velocity_brake_trajectory(inp.current_acceleration[dof], inp.max_acceleration[dof], inp_min_acceleration[dof], inp.max_jerk[dof]);
                        // p.accel.get_velocity_brake_trajectory(inp.target_acceleration[dof], inp.max_acceleration[dof], inp_min_acceleration[dof], inp.max_jerk[dof]);
                    } else {
                        p.brake.get_second_order_velocity_brake_trajectory();
                        // p.accel.get_second_order_velocity_brake_trajectory();
                    }
                    p.set_boundary_for_velocity(inp.current_position[dof], inp.current_velocity[dof], inp.current_acceleration[dof], inp.target_velocity[dof], inp.target_acceleration[dof]);
                } break;
            }

            // Finalize pre & post-trajectories
            if (!std::isinf(inp.max_jerk[dof])) {
                p.brake.finalize(p.p[0], p.v[0], p.a[0]);
                // p.accel.finalize(p.pf, p.vf, p.af);
            } else if (!std::isinf(inp.max_acceleration[dof])) {
                p.brake.finalize_second_order(p.p[0], p.v[0], p.a[0]);
                // p.accel.finalize_second_order(p.pf, p.vf, p.af);
            }

            bool found_profile {false};
            switch (inp_per_dof_control_interface[dof]) {
                case ControlInterface::Position: {
                    if (!std::isinf(inp.max_jerk[dof])) {
                        PositionThirdOrderStep1 step1 {p.p[0], p.v[0], p.a[0], p.pf, p.vf, p.af, inp.max_velocity[dof], inp_min_velocity[dof], inp.max_acceleration[dof], inp_min_acceleration[dof], inp.max_jerk[dof]};
                        found_profile = step1.get_profile(p, blocks[dof]);
                    } else if (!std::isinf(inp.max_acceleration[dof])) {
                        PositionSecondOrderStep1 step1 {p.p[0], p.v[0], p.pf, p.vf, inp.max_velocity[dof], inp_min_velocity[dof], inp.max_acceleration[dof], inp_min_acceleration[dof]};
                        found_profile = step1.get_profile(p, blocks[dof]);
                    } else {
                        PositionFirstOrderStep1 step1 {p.p[0], p.pf, inp.max_velocity[dof], inp_min_velocity[dof]};
                        found_profile = step1.get_profile(p, blocks[dof]);
                    }
                } break;
                case ControlInterface::Velocity: {
                    if (!std::isinf(inp.max_jerk[dof])) {
                        VelocityThirdOrderStep1 step1 {p.v[0], p.a[0], p.vf, p.af, inp.max_acceleration[dof], inp_min_acceleration[dof], inp.max_jerk[dof]};
                        found_profile = step1.get_profile(p, blocks[dof]);
                    } else {
                        VelocitySecondOrderStep1 step1 {p.v[0], p.vf, inp.max_acceleration[dof], inp_min_acceleration[dof]};
                        found_profile = step1.get_profile(p, blocks[dof]);
                    }
                } break;
            }

            if (!found_profile) {
                const bool has_zero_limits = (inp.max_acceleration[dof] == 0.0 || inp_min_acceleration[dof] == 0.0 || inp.max_jerk[dof] == 0.0);
                if (has_zero_limits) {
                    if constexpr (throw_error) {
                        throw RuckigError("zero limits conflict in step 1, dof: " + std::to_string(dof) + " input: " + inp.to_string());
                    } else {
                        return Result::ErrorZeroLimits;
                    }

                } else {
                    if constexpr (throw_error) {
                        throw RuckigError("error in step 1, dof: " + std::to_string(dof) + " input: " + inp.to_string());
                    } else {
                        return Result::ErrorExecutionTimeCalculation;
                    }
                }
            }

            traj.independent_min_durations[dof] = blocks[dof].t_min;
            // std::cout << dof << " profile step1: " << blocks[dof].to_string() << std::endl;
        }

        const bool discrete_duration = (inp.duration_discretization == DurationDiscretization::Discrete);
        if (degrees_of_freedom == 1 && !inp.minimum_duration && !discrete_duration) {
            traj.duration = blocks[0].t_min;
            traj.profiles[0][0] = blocks[0].p_min;
            traj.cumulative_times[0] = traj.duration;
            return Result::Working;
        }

        std::optional<size_t> limiting_dof; // The DoF that doesn't need step 2
        const bool found_synchronization = synchronize(inp.minimum_duration, traj.duration, limiting_dof, traj.profiles[0], discrete_duration, delta_time);
        if (!found_synchronization) {
            bool has_zero_limits = false;
            for (size_t dof = 0; dof < degrees_of_freedom; ++dof) {
                if (inp.max_acceleration[dof] == 0.0 || inp_min_acceleration[dof] == 0.0 || inp.max_jerk[dof] == 0.0) {
                    has_zero_limits = true;
                    break;
                }
            }

            if (has_zero_limits) {
                if constexpr (throw_error) {
                    throw RuckigError("zero limits conflict with other degrees of freedom in time synchronization " + std::to_string(traj.duration));
                } else {
                    return Result::ErrorZeroLimits;
                }

            } else {
                if constexpr (throw_error) {
                    throw RuckigError("error in time synchronization: " + std::to_string(traj.duration));
                } else {
                    return Result::ErrorSynchronizationCalculation;
                }
            }
        }

        // None Synchronization
        for (size_t dof = 0; dof < degrees_of_freedom; ++dof) {
            if (inp.enabled[dof] && inp_per_dof_synchronization[dof] == Synchronization::None) {
                traj.profiles[0][dof] = blocks[dof].p_min;
                if (blocks[dof].t_min > traj.duration) {
                    traj.duration = blocks[dof].t_min;
                    limiting_dof = dof;
                }
            }
        }
        traj.cumulative_times[0] = traj.duration;

        if constexpr (return_error_at_maximal_duration) {
            if (traj.duration > 7.6e3) {
                return Result::ErrorTrajectoryDuration;
            }
        }

        if (traj.duration == 0.0) {
            // Copy all profiles for end state
            for (size_t dof = 0; dof < degrees_of_freedom; ++dof) {
                traj.profiles[0][dof] = blocks[dof].p_min;
            }
            return Result::Working;
        }

        if (!discrete_duration && std::all_of(inp_per_dof_synchronization.begin(), inp_per_dof_synchronization.end(), [](Synchronization s){ return s == Synchronization::None; })) {
            return Result::Working;
        }

        // Phase Synchronization
        if (limiting_dof && std::any_of(inp_per_dof_synchronization.begin(), inp_per_dof_synchronization.end(), [](Synchronization s){ return s == Synchronization::Phase; })) {
            const Profile& p_limiting = traj.profiles[0][limiting_dof.value()];
            if (is_input_collinear(inp, p_limiting.direction, limiting_dof.value())) {
                bool found_time_synchronization {true};
                for (size_t dof = 0; dof < degrees_of_freedom; ++dof) {
                    if (!inp.enabled[dof] || dof == limiting_dof || inp_per_dof_synchronization[dof] != Synchronization::Phase) {
                        continue;
                    }

                    Profile& p = traj.profiles[0][dof];
                    const double t_profile = traj.duration - p.brake.duration - p.accel.duration;

                    p.t = p_limiting.t; // Copy timing information from limiting DoF
                    p.control_signs = p_limiting.control_signs;

                    // Profile::ReachedLimits::NONE is a small hack, as there is no specialization for that in the check function
                    switch (inp_per_dof_control_interface[dof]) {
                        case ControlInterface::Position: {
                            switch (p.control_signs) {
                                case Profile::ControlSigns::UDDU: {
                                    if (!std::isinf(inp.max_jerk[dof])) {
                                        found_time_synchronization &= p.check_with_timing<Profile::ControlSigns::UDDU, Profile::ReachedLimits::NONE>(t_profile, new_phase_control[dof], inp.max_velocity[dof], inp_min_velocity[dof], inp.max_acceleration[dof], inp_min_acceleration[dof], inp.max_jerk[dof]);
                                    } else if (!std::isinf(inp.max_acceleration[dof])) {
                                        found_time_synchronization &= p.check_for_second_order_with_timing<Profile::ControlSigns::UDDU, Profile::ReachedLimits::NONE>(t_profile, new_phase_control[dof], -new_phase_control[dof], inp.max_velocity[dof], inp_min_velocity[dof], inp.max_acceleration[dof], inp_min_acceleration[dof]);
                                    } else {
                                        found_time_synchronization &= p.check_for_first_order_with_timing<Profile::ControlSigns::UDDU, Profile::ReachedLimits::NONE>(t_profile, new_phase_control[dof], inp.max_velocity[dof], inp_min_velocity[dof]);
                                    }
                                } break;
                                case Profile::ControlSigns::UDUD: {
                                    if (!std::isinf(inp.max_jerk[dof])) {
                                        found_time_synchronization &= p.check_with_timing<Profile::ControlSigns::UDUD, Profile::ReachedLimits::NONE>(t_profile, new_phase_control[dof], inp.max_velocity[dof], inp_min_velocity[dof], inp.max_acceleration[dof], inp_min_acceleration[dof], inp.max_jerk[dof]);
                                    } else {
                                        found_time_synchronization &= p.check_for_second_order_with_timing<Profile::ControlSigns::UDUD, Profile::ReachedLimits::NONE>(t_profile, new_phase_control[dof], -new_phase_control[dof], inp.max_velocity[dof], inp_min_velocity[dof], inp.max_acceleration[dof], inp_min_acceleration[dof]);
                                    }
                                } break;
                            }
                        } break;
                        case ControlInterface::Velocity: {
                            switch (p.control_signs) {
                                case Profile::ControlSigns::UDDU: {
                                    if (!std::isinf(inp.max_jerk[dof])) {
                                        found_time_synchronization &= p.check_for_velocity_with_timing<Profile::ControlSigns::UDDU, Profile::ReachedLimits::NONE>(t_profile, new_phase_control[dof], inp.max_acceleration[dof], inp_min_acceleration[dof], inp.max_jerk[dof]);
                                    } else {
                                        found_time_synchronization &= p.check_for_second_order_velocity_with_timing<Profile::ControlSigns::UDDU, Profile::ReachedLimits::NONE>(t_profile, new_phase_control[dof], inp.max_acceleration[dof], inp_min_acceleration[dof]);
                                    }
                                } break;
                                case Profile::ControlSigns::UDUD: {
                                    if (!std::isinf(inp.max_jerk[dof])) {
                                        found_time_synchronization &= p.check_for_velocity_with_timing<Profile::ControlSigns::UDUD, Profile::ReachedLimits::NONE>(t_profile, new_phase_control[dof], inp.max_acceleration[dof], inp_min_acceleration[dof], inp.max_jerk[dof]);
                                    } else {
                                        found_time_synchronization &= p.check_for_second_order_velocity_with_timing<Profile::ControlSigns::UDUD, Profile::ReachedLimits::NONE>(t_profile, new_phase_control[dof], inp.max_acceleration[dof], inp_min_acceleration[dof]);
                                    }
                                } break;
                            }
                        } break;
                    }

                    p.limits = p_limiting.limits; // After check method call to set correct limits
                }

                if (found_time_synchronization && std::all_of(inp_per_dof_synchronization.begin(), inp_per_dof_synchronization.end(), [](Synchronization s){ return s == Synchronization::Phase || s == Synchronization::None; })) {
                    return Result::Working;
                }
            }
        }

        // Time Synchronization
        for (size_t dof = 0; dof < degrees_of_freedom; ++dof) {
            const bool skip_synchronization = (dof == limiting_dof || inp_per_dof_synchronization[dof] == Synchronization::None) && !discrete_duration;
            if (!inp.enabled[dof] || skip_synchronization) {
                continue;
            }

            Profile& p = traj.profiles[0][dof];
            const double t_profile = traj.duration - p.brake.duration - p.accel.duration;

            if (inp_per_dof_synchronization[dof] == Synchronization::TimeIfNecessary && std::abs(inp.target_velocity[dof]) < eps && std::abs(inp.target_acceleration[dof]) < eps) {
                p = blocks[dof].p_min;
                continue;
            }

            // Check if the final time corresponds to an extremal profile calculated in step 1
            // Use 2*eps because of numerical robustness in duration discretization
            if (std::abs(t_profile - blocks[dof].t_min) < 2*eps) {
                p = blocks[dof].p_min;
                continue;
            } else if (blocks[dof].a && std::abs(t_profile - blocks[dof].a->right) < 2*eps) {
                p = blocks[dof].a->profile;
                continue;
            } else if (blocks[dof].b && std::abs(t_profile - blocks[dof].b->right) < 2*eps) {
                p = blocks[dof].b->profile;
                continue;
            }

            bool found_time_synchronization {false};
            switch (inp_per_dof_control_interface[dof]) {
                case ControlInterface::Position: {
                    if (!std::isinf(inp.max_jerk[dof])) {
                        PositionThirdOrderStep2 step2 {t_profile, p.p[0], p.v[0], p.a[0], p.pf, p.vf, p.af, inp.max_velocity[dof], inp_min_velocity[dof], inp.max_acceleration[dof], inp_min_acceleration[dof], inp.max_jerk[dof]};
                        found_time_synchronization = step2.get_profile(p);
                    } else if (!std::isinf(inp.max_acceleration[dof])) {
                        PositionSecondOrderStep2 step2 {t_profile, p.p[0], p.v[0], p.pf, p.vf, inp.max_velocity[dof], inp_min_velocity[dof], inp.max_acceleration[dof], inp_min_acceleration[dof]};
                        found_time_synchronization = step2.get_profile(p);
                    } else {
                        PositionFirstOrderStep2 step2 {t_profile, p.p[0], p.pf, inp.max_velocity[dof], inp_min_velocity[dof]};
                        found_time_synchronization = step2.get_profile(p);
                    }
                } break;
                case ControlInterface::Velocity: {
                    if (!std::isinf(inp.max_jerk[dof])) {
                        VelocityThirdOrderStep2 step2 {t_profile, p.v[0], p.a[0], p.vf, p.af, inp.max_acceleration[dof], inp_min_acceleration[dof], inp.max_jerk[dof]};
                        found_time_synchronization = step2.get_profile(p);
                    } else {
                        VelocitySecondOrderStep2 step2 {t_profile, p.v[0], p.vf, inp.max_acceleration[dof], inp_min_acceleration[dof]};
                        found_time_synchronization = step2.get_profile(p);
                    }
                } break;
            }
            if (!found_time_synchronization) {
                if constexpr (throw_error) {
                    throw RuckigError("error in step 2 in dof: " + std::to_string(dof) + " for t sync: " + std::to_string(traj.duration) + " input: " + inp.to_string());
                } else {
                    return Result::ErrorSynchronizationCalculation;
                }
            }
            // std::cout << dof << " profile step2: " << p.to_string() << std::endl;
        }

        return Result::Working;
    }